

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex00e1.cpp
# Opt level: O1

int main(void)

{
  long lVar1;
  undefined1 uVar2;
  ostream oVar3;
  istream *piVar4;
  ostream *this;
  ostream *poVar5;
  int h;
  int m;
  int d;
  int local_1c;
  uint local_18;
  int local_14;
  
  piVar4 = (istream *)std::istream::operator>>((istream *)&std::cin,&local_1c);
  piVar4 = (istream *)std::istream::operator>>(piVar4,(int *)&local_18);
  std::istream::operator>>(piVar4,&local_14);
  lVar1 = std::cout;
  local_18 = local_18 + local_14;
  if (0x3b < (int)local_18) {
    local_1c = local_1c + local_18 / 0x3c;
    local_18 = local_18 % 0x3c;
  }
  local_1c = local_1c +
             (((uint)(local_1c / 6 + (local_1c >> 0x1f)) >> 2) - (local_1c >> 0x1f)) * -0x18;
  *(undefined8 *)(std::ostream::operator<< + *(long *)(std::cout + -0x18)) = 2;
  lVar1 = *(long *)(lVar1 + -0x18);
  if (*(char *)(lVar1 + 0x105109) == '\0') {
    uVar2 = std::ios::widen((char)lVar1 + '(');
    *(undefined1 *)(lVar1 + 0x105108) = uVar2;
    *(undefined1 *)(lVar1 + 0x105109) = 1;
  }
  *(undefined1 *)(lVar1 + 0x105108) = 0x30;
  this = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_1c);
  std::__ostream_insert<char,std::char_traits<char>>(this," ",1);
  lVar1 = *(long *)this;
  *(undefined8 *)(this + *(long *)(lVar1 + -0x18) + 0x10) = 2;
  lVar1 = *(long *)(lVar1 + -0x18);
  poVar5 = this + lVar1;
  if (this[lVar1 + 0xe1] == (ostream)0x0) {
    oVar3 = (ostream)std::ios::widen((char)poVar5);
    poVar5[0xe0] = oVar3;
    poVar5[0xe1] = (ostream)0x1;
  }
  poVar5[0xe0] = (ostream)0x30;
  poVar5 = (ostream *)std::ostream::operator<<(this,local_18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
  return 0;
}

Assistant:

int main() {
    int h, m, d;
    cin >> h >> m >> d;
    m += d;
    if (m >= 60) {
        h += (m / 60);
        m %= 60;
    }
    h %= 24;
    cout << setw(2) << setfill('0') << h << " " << setw(2) << setfill('0') << m
         << "\n";
}